

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O1

int tjCompressFromYUVPlanes
              (tjhandle handle,uchar **srcPlanes,int width,int *strides,int height,int subsamp,
              uchar **jpegBuf,unsigned_long *jpegSize,int jpegQual,int flags)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  uint alloc;
  uint uVar6;
  uint uVar7;
  void *pvVar8;
  undefined8 *puVar9;
  unsigned_long uVar10;
  ulong uVar11;
  void *pvVar12;
  ulong uVar13;
  JSAMPARRAY ppJVar14;
  int iVar15;
  ulong uVar16;
  size_t sVar17;
  ulong uVar18;
  void *pvVar19;
  char *pcVar20;
  long lVar21;
  uchar *puVar22;
  ulong uVar23;
  size_t sVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  int iVar29;
  long lVar30;
  uint uVar31;
  long lVar32;
  bool bVar33;
  JSAMPROW *tmpbuf [10];
  JSAMPROW *inbuf [10];
  int iw [10];
  int th [10];
  int ph [10];
  int pw [10];
  JSAMPARRAY yuvptr [10];
  long local_1e8 [20];
  uint auStack_148 [12];
  uint auStack_118 [12];
  int aiStack_e8 [12];
  uint auStack_b8 [12];
  JSAMPARRAY local_88 [11];
  
  if (handle == (tjhandle)0x0) {
    puVar9 = (undefined8 *)__tls_get_addr(&PTR_0019df20);
    *(undefined8 *)((long)puVar9 + 7) = 0x656c646e616820;
    *puVar9 = 0x2064696c61766e49;
    return -1;
  }
  *(undefined4 *)((long)handle + 0x5f8) = 0;
  *(undefined4 *)((long)handle + 0x6d0) = 0;
  *(uint *)((long)handle + 0x5fc) = (uint)flags >> 0xd & 1;
  local_1e8[8] = 0;
  local_1e8[9] = 0;
  local_1e8[6] = 0;
  local_1e8[7] = 0;
  local_1e8[4] = 0;
  local_1e8[5] = 0;
  local_1e8[2] = 0;
  local_1e8[3] = 0;
  local_1e8[0] = 0;
  local_1e8[1] = 0;
  local_1e8[10] = 0;
  local_1e8[0xb] = 0;
  local_1e8[0xc] = 0;
  local_1e8[0xd] = 0;
  local_1e8[0xe] = 0;
  local_1e8[0xf] = 0;
  local_1e8[0x10] = 0;
  local_1e8[0x11] = 0;
  local_1e8[0x12] = 0;
  local_1e8[0x13] = 0;
  if ((*(byte *)((long)handle + 0x600) & 1) == 0) {
    memcpy((void *)((long)handle + 0x608),
           "tjCompressFromYUVPlanes(): Instance has not been initialized for compression",0x4d);
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    pvVar8 = (void *)__tls_get_addr(&PTR_0019df20);
    memcpy(pvVar8,"tjCompressFromYUVPlanes(): Instance has not been initialized for compression",
           0x4d);
  }
  else {
    if ((((((srcPlanes != (uchar **)0x0) && ((uint)jpegQual < 0x65)) &&
          (jpegSize != (unsigned_long *)0x0)) && ((jpegBuf != (uchar **)0x0 && ((uint)subsamp < 6)))
         ) && ((0 < height && ((0 < width && (*srcPlanes != (uchar *)0x0)))))) &&
       ((subsamp == 3 || ((srcPlanes[1] != (uchar *)0x0 && (srcPlanes[2] != (uchar *)0x0)))))) {
      iVar5 = _setjmp((__jmp_buf_tag *)((long)handle + 0x528));
      if (iVar5 != 0) {
        alloc = 1;
        pvVar8 = (void *)0x0;
        uVar31 = 0xffffffff;
        goto LAB_001381b1;
      }
      *(int *)((long)handle + 0x30) = width;
      *(int *)((long)handle + 0x34) = height;
      if ((flags & 8U) == 0) {
        if ((flags & 0x10U) != 0) {
          pcVar20 = "JSIMD_FORCESSE=1";
          goto LAB_0013826d;
        }
        if ((flags & 0x20U) != 0) {
          pcVar20 = "JSIMD_FORCESSE2=1";
          goto LAB_0013826d;
        }
      }
      else {
        pcVar20 = "JSIMD_FORCEMMX=1";
LAB_0013826d:
        putenv(pcVar20);
      }
      bVar33 = ((uint)flags >> 10 & 1) == 0;
      if (!bVar33) {
        uVar10 = tjBufSize(width,height,subsamp);
        *jpegSize = uVar10;
      }
      alloc = (uint)bVar33;
      jpeg_mem_dest_tj((j_compress_ptr)handle,jpegBuf,jpegSize,alloc);
      uVar31 = 0;
      setCompDefaults((jpeg_compress_struct *)handle,0,subsamp,jpegQual,flags);
      *(undefined4 *)((long)handle + 0x100) = 1;
      jpeg_start_compress((j_compress_ptr)handle,1);
      iVar5 = *(int *)((long)handle + 0x4c);
      uVar11 = (ulong)iVar5;
      if ((long)uVar11 < 1) {
        bVar33 = true;
        sVar24 = 0;
      }
      else {
        lVar32 = *(long *)((long)handle + 0x58);
        uVar6 = *(uint *)((long)handle + 0x138);
        uVar1 = *(uint *)((long)handle + 0x13c);
        pcVar20 = (char *)__tls_get_addr(&PTR_0019df20);
        uVar16 = 0;
        uVar13 = uVar16;
        uVar23 = uVar16;
        uVar18 = uVar16;
        do {
          uVar7 = (uint)uVar16;
          lVar21 = uVar23 * 0x60;
          uVar27 = *(int *)(lVar32 + 0x1c + lVar21) * 8;
          auStack_148[uVar23] = uVar27;
          iVar15 = *(int *)(lVar32 + 0x20 + lVar21);
          uVar31 = (((*(int *)((long)handle + 0x30) + uVar6) - 1 & -uVar6) *
                   *(int *)(lVar32 + 8 + lVar21)) / uVar6;
          auStack_b8[uVar23] = uVar31;
          iVar2 = *(int *)(lVar32 + 0xc + lVar21);
          uVar16 = (ulong)(((*(int *)((long)handle + 0x34) + uVar1) - 1 & -uVar1) * iVar2) /
                   (ulong)uVar1;
          iVar29 = (int)uVar16;
          aiStack_e8[uVar23] = iVar29;
          if (iVar15 << 3 != iVar29 || uVar27 != uVar31) {
            uVar7 = 1;
          }
          uVar28 = iVar2 * 8;
          auStack_118[uVar23] = uVar28;
          pvVar8 = malloc((long)iVar29 << 3);
          local_1e8[uVar23 + 10] = (long)pvVar8;
          if (pvVar8 == (void *)0x0) {
            builtin_strncpy((char *)((long)handle + 0x628),"y alloca",8);
            builtin_strncpy((char *)((long)handle + 0x630),"tion fai",8);
            builtin_strncpy((char *)((long)handle + 0x618),"VPlanes(",8);
            builtin_strncpy((char *)((long)handle + 0x620),"): Memor",8);
            builtin_strncpy((char *)((long)handle + 0x608),"tjCompre",8);
            builtin_strncpy((char *)((long)handle + 0x610),"ssFromYU",8);
            *(undefined8 *)((long)handle + 0x635) = 0x6572756c696166;
            *(undefined4 *)((long)handle + 0x6d0) = 1;
            builtin_strncpy(pcVar20,"tjCompressFromYUVPlanes(): Memory allocation failure",0x35);
            iVar15 = 5;
            uVar13 = 0xffffffff;
          }
          else {
            if (0 < iVar29) {
              puVar22 = srcPlanes[uVar23];
              uVar26 = 0;
              do {
                *(uchar **)((long)pvVar8 + uVar26 * 8) = puVar22;
                if ((strides == (int *)0x0) || (uVar25 = strides[uVar23], strides[uVar23] == 0)) {
                  uVar25 = uVar31;
                }
                puVar22 = puVar22 + (int)uVar25;
                uVar26 = uVar26 + 1;
              } while (uVar26 < uVar16);
            }
            iVar15 = 0;
          }
          uVar31 = (uint)uVar13;
          if (iVar15 != 0) {
            if (iVar15 != 5) {
              return iVar15;
            }
            pvVar8 = (void *)0x0;
            goto LAB_001381b1;
          }
          uVar27 = (int)uVar18 + uVar28 * uVar27;
          uVar23 = uVar23 + 1;
          uVar16 = (ulong)uVar7;
          uVar18 = (ulong)uVar27;
        } while (uVar23 != uVar11);
        bVar33 = uVar7 == 0;
        sVar24 = (size_t)(int)uVar27;
      }
      if (bVar33) {
        pvVar8 = (void *)0x0;
      }
      else {
        pvVar8 = malloc(sVar24);
        if (pvVar8 == (void *)0x0) {
          builtin_strncpy((char *)((long)handle + 0x628),"y alloca",8);
          builtin_strncpy((char *)((long)handle + 0x630),"tion fai",8);
          builtin_strncpy((char *)((long)handle + 0x618),"VPlanes(",8);
          builtin_strncpy((char *)((long)handle + 0x620),"): Memor",8);
          builtin_strncpy((char *)((long)handle + 0x608),"tjCo",4);
          builtin_strncpy((char *)((long)handle + 0x60c),"mpre",4);
          builtin_strncpy((char *)((long)handle + 0x610),"ssFr",4);
          builtin_strncpy((char *)((long)handle + 0x614),"omYU",4);
          *(undefined8 *)((long)handle + 0x635) = 0x6572756c696166;
          *(undefined4 *)((long)handle + 0x6d0) = 1;
          pcVar20 = (char *)__tls_get_addr(&PTR_0019df20);
          builtin_strncpy(pcVar20,"tjCompressFromYUVPlanes(): Memory allocation failure",0x35);
          pvVar8 = (void *)0x0;
          uVar31 = 0xffffffff;
          goto LAB_001381b1;
        }
        if (0 < iVar5) {
          uVar13 = 0;
          pvVar19 = pvVar8;
          do {
            uVar6 = auStack_118[uVar13];
            pvVar12 = malloc((long)(int)uVar6 * 8);
            local_1e8[uVar13] = (long)pvVar12;
            if (pvVar12 == (void *)0x0) {
              builtin_strncpy((char *)((long)handle + 0x628),"y alloca",8);
              builtin_strncpy((char *)((long)handle + 0x630),"tion fai",8);
              builtin_strncpy((char *)((long)handle + 0x618),"VPlanes(",8);
              builtin_strncpy((char *)((long)handle + 0x620),"): Memor",8);
              builtin_strncpy((char *)((long)handle + 0x608),"tjCo",4);
              builtin_strncpy((char *)((long)handle + 0x60c),"mpre",4);
              builtin_strncpy((char *)((long)handle + 0x610),"ssFr",4);
              builtin_strncpy((char *)((long)handle + 0x614),"omYU",4);
              *(undefined8 *)((long)handle + 0x635) = 0x6572756c696166;
              *(undefined4 *)((long)handle + 0x6d0) = 1;
              pcVar20 = (char *)__tls_get_addr(&PTR_0019df20);
              builtin_strncpy(pcVar20,"tjCompressFromYUVPlanes(): Memory allocation failure",0x35);
              goto LAB_00138593;
            }
            if (0 < (int)uVar6) {
              uVar1 = auStack_148[uVar13];
              lVar32 = 0;
              do {
                *(void **)((long)pvVar12 + lVar32 * 8) = pvVar19;
                pvVar19 = (void *)((long)pvVar19 + (long)(int)uVar1);
                lVar32 = lVar32 + 1;
              } while ((int)uVar6 != lVar32);
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 != uVar11);
        }
      }
      iVar5 = _setjmp((__jmp_buf_tag *)((long)handle + 0x528));
      if (iVar5 == 0) {
        if (0 < *(int *)((long)handle + 0x34)) {
          iVar5 = 0;
          do {
            if (0 < *(int *)((long)handle + 0x4c)) {
              lVar32 = 0;
              do {
                uVar6 = (*(int *)(*(long *)((long)handle + 0x58) + 0xc + lVar32 * 0x60) * iVar5) /
                        *(int *)((long)handle + 0x13c);
                lVar21 = (long)(int)uVar6;
                if (bVar33) {
                  ppJVar14 = (JSAMPARRAY)(lVar21 * 8 + local_1e8[lVar32 + 10]);
                }
                else {
                  uVar1 = auStack_118[lVar32];
                  iVar15 = aiStack_e8[lVar32];
                  uVar27 = iVar15 - uVar6;
                  uVar7 = uVar27;
                  if ((int)uVar1 < (int)uVar27) {
                    uVar7 = uVar1;
                  }
                  if (0 < (int)uVar7) {
                    lVar3 = local_1e8[lVar32];
                    uVar28 = auStack_b8[lVar32];
                    sVar24 = (size_t)(int)uVar28;
                    uVar25 = auStack_148[lVar32];
                    lVar30 = local_1e8[lVar32 + 10];
                    uVar11 = 0;
                    do {
                      memcpy(*(void **)(lVar3 + uVar11 * 8),
                             *(void **)(lVar21 * 8 + lVar30 + uVar11 * 8),sVar24);
                      sVar17 = sVar24;
                      if ((int)uVar28 < (int)uVar25) {
                        do {
                          lVar4 = *(long *)(lVar3 + uVar11 * 8);
                          *(undefined1 *)(lVar4 + sVar17) = *(undefined1 *)(lVar4 + -1 + sVar24);
                          sVar17 = sVar17 + 1;
                        } while ((long)(int)uVar25 != sVar17);
                      }
                      uVar11 = uVar11 + 1;
                    } while (uVar11 != uVar7);
                  }
                  if ((int)uVar27 < (int)uVar1) {
                    lVar3 = local_1e8[lVar32];
                    uVar7 = auStack_148[lVar32];
                    lVar30 = 0;
                    do {
                      memcpy(*(void **)((long)iVar15 * 8 + lVar21 * -8 + lVar3 + lVar30 * 8),
                             *(void **)(lVar3 + (long)(int)(~uVar6 + iVar15) * 8),(long)(int)uVar7);
                      lVar30 = lVar30 + 1;
                    } while ((uVar1 + uVar6) - iVar15 != (int)lVar30);
                  }
                  ppJVar14 = (JSAMPARRAY)local_1e8[lVar32];
                }
                local_88[lVar32] = ppJVar14;
                lVar32 = lVar32 + 1;
              } while (lVar32 < *(int *)((long)handle + 0x4c));
            }
            jpeg_write_raw_data((j_compress_ptr)handle,local_88,*(int *)((long)handle + 0x13c) << 3)
            ;
            iVar5 = iVar5 + *(int *)((long)handle + 0x13c) * 8;
          } while (iVar5 < *(int *)((long)handle + 0x34));
        }
        jpeg_finish_compress((j_compress_ptr)handle);
      }
      else {
LAB_00138593:
        uVar31 = 0xffffffff;
      }
      goto LAB_001381b1;
    }
    builtin_strncpy((char *)((long)handle + 0x624),"nvalid a",8);
    builtin_strncpy((char *)((long)handle + 0x62c),"rgument",8);
    builtin_strncpy((char *)((long)handle + 0x618),"VPlanes(",8);
    builtin_strncpy((char *)((long)handle + 0x620),"): Inval",8);
    builtin_strncpy((char *)((long)handle + 0x608),"tjCo",4);
    builtin_strncpy((char *)((long)handle + 0x60c),"mpre",4);
    builtin_strncpy((char *)((long)handle + 0x610),"ssFr",4);
    builtin_strncpy((char *)((long)handle + 0x614),"omYU",4);
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    pcVar20 = (char *)__tls_get_addr(&PTR_0019df20);
    builtin_strncpy(pcVar20,"tjCompressFromYUVPlanes(): Invalid argument",0x2c);
  }
  uVar31 = 0xffffffff;
  alloc = 1;
  pvVar8 = (void *)0x0;
LAB_001381b1:
  if (100 < *(int *)((long)handle + 0x24)) {
    if (alloc != 0) {
      (**(code **)(*(long *)((long)handle + 0x28) + 0x20))(handle);
    }
    jpeg_abort_compress((j_compress_ptr)handle);
  }
  lVar32 = 0;
  do {
    free((void *)local_1e8[lVar32]);
    free((void *)local_1e8[lVar32 + 10]);
    lVar32 = lVar32 + 1;
  } while (lVar32 != 10);
  free(pvVar8);
  *(undefined4 *)((long)handle + 0x5fc) = 0;
  return -(uint)(*(int *)((long)handle + 0x5f8) != 0) | uVar31;
}

Assistant:

DLLEXPORT int tjCompressFromYUVPlanes(tjhandle handle,
                                      const unsigned char **srcPlanes,
                                      int width, const int *strides,
                                      int height, int subsamp,
                                      unsigned char **jpegBuf,
                                      unsigned long *jpegSize, int jpegQual,
                                      int flags)
{
  int i, row, retval = 0, alloc = 1;
  int pw[MAX_COMPONENTS], ph[MAX_COMPONENTS], iw[MAX_COMPONENTS],
    tmpbufsize = 0, usetmpbuf = 0, th[MAX_COMPONENTS];
  JSAMPLE *_tmpbuf = NULL, *ptr;
  JSAMPROW *inbuf[MAX_COMPONENTS], *tmpbuf[MAX_COMPONENTS];

  GET_CINSTANCE(handle)
  this->jerr.stopOnWarning = (flags & TJFLAG_STOPONWARNING) ? TRUE : FALSE;

  for (i = 0; i < MAX_COMPONENTS; i++) {
    tmpbuf[i] = NULL;  inbuf[i] = NULL;
  }

  if ((this->init & COMPRESS) == 0)
    THROW("tjCompressFromYUVPlanes(): Instance has not been initialized for compression");

  if (!srcPlanes || !srcPlanes[0] || width <= 0 || height <= 0 ||
      subsamp < 0 || subsamp >= NUMSUBOPT || jpegBuf == NULL ||
      jpegSize == NULL || jpegQual < 0 || jpegQual > 100)
    THROW("tjCompressFromYUVPlanes(): Invalid argument");
  if (subsamp != TJSAMP_GRAY && (!srcPlanes[1] || !srcPlanes[2]))
    THROW("tjCompressFromYUVPlanes(): Invalid argument");

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  cinfo->image_width = width;
  cinfo->image_height = height;

#ifndef NO_PUTENV
  if (flags & TJFLAG_FORCEMMX) putenv("JSIMD_FORCEMMX=1");
  else if (flags & TJFLAG_FORCESSE) putenv("JSIMD_FORCESSE=1");
  else if (flags & TJFLAG_FORCESSE2) putenv("JSIMD_FORCESSE2=1");
#endif

  if (flags & TJFLAG_NOREALLOC) {
    alloc = 0;  *jpegSize = tjBufSize(width, height, subsamp);
  }
  jpeg_mem_dest_tj(cinfo, jpegBuf, jpegSize, alloc);
  setCompDefaults(cinfo, TJPF_RGB, subsamp, jpegQual, flags);
  cinfo->raw_data_in = TRUE;

  jpeg_start_compress(cinfo, TRUE);
  for (i = 0; i < cinfo->num_components; i++) {
    jpeg_component_info *compptr = &cinfo->comp_info[i];
    int ih;

    iw[i] = compptr->width_in_blocks * DCTSIZE;
    ih = compptr->height_in_blocks * DCTSIZE;
    pw[i] = PAD(cinfo->image_width, cinfo->max_h_samp_factor) *
            compptr->h_samp_factor / cinfo->max_h_samp_factor;
    ph[i] = PAD(cinfo->image_height, cinfo->max_v_samp_factor) *
            compptr->v_samp_factor / cinfo->max_v_samp_factor;
    if (iw[i] != pw[i] || ih != ph[i]) usetmpbuf = 1;
    th[i] = compptr->v_samp_factor * DCTSIZE;
    tmpbufsize += iw[i] * th[i];
    if ((inbuf[i] = (JSAMPROW *)malloc(sizeof(JSAMPROW) * ph[i])) == NULL)
      THROW("tjCompressFromYUVPlanes(): Memory allocation failure");
    ptr = (JSAMPLE *)srcPlanes[i];
    for (row = 0; row < ph[i]; row++) {
      inbuf[i][row] = ptr;
      ptr += (strides && strides[i] != 0) ? strides[i] : pw[i];
    }
  }
  if (usetmpbuf) {
    if ((_tmpbuf = (JSAMPLE *)malloc(sizeof(JSAMPLE) * tmpbufsize)) == NULL)
      THROW("tjCompressFromYUVPlanes(): Memory allocation failure");
    ptr = _tmpbuf;
    for (i = 0; i < cinfo->num_components; i++) {
      if ((tmpbuf[i] = (JSAMPROW *)malloc(sizeof(JSAMPROW) * th[i])) == NULL)
        THROW("tjCompressFromYUVPlanes(): Memory allocation failure");
      for (row = 0; row < th[i]; row++) {
        tmpbuf[i][row] = ptr;
        ptr += iw[i];
      }
    }
  }

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  for (row = 0; row < (int)cinfo->image_height;
       row += cinfo->max_v_samp_factor * DCTSIZE) {
    JSAMPARRAY yuvptr[MAX_COMPONENTS];
    int crow[MAX_COMPONENTS];

    for (i = 0; i < cinfo->num_components; i++) {
      jpeg_component_info *compptr = &cinfo->comp_info[i];

      crow[i] = row * compptr->v_samp_factor / cinfo->max_v_samp_factor;
      if (usetmpbuf) {
        int j, k;

        for (j = 0; j < MIN(th[i], ph[i] - crow[i]); j++) {
          memcpy(tmpbuf[i][j], inbuf[i][crow[i] + j], pw[i]);
          /* Duplicate last sample in row to fill out MCU */
          for (k = pw[i]; k < iw[i]; k++)
            tmpbuf[i][j][k] = tmpbuf[i][j][pw[i] - 1];
        }
        /* Duplicate last row to fill out MCU */
        for (j = ph[i] - crow[i]; j < th[i]; j++)
          memcpy(tmpbuf[i][j], tmpbuf[i][ph[i] - crow[i] - 1], iw[i]);
        yuvptr[i] = tmpbuf[i];
      } else
        yuvptr[i] = &inbuf[i][crow[i]];
    }
    jpeg_write_raw_data(cinfo, yuvptr, cinfo->max_v_samp_factor * DCTSIZE);
  }
  jpeg_finish_compress(cinfo);

bailout:
  if (cinfo->global_state > CSTATE_START) {
    if (alloc) (*cinfo->dest->term_destination) (cinfo);
    jpeg_abort_compress(cinfo);
  }
  for (i = 0; i < MAX_COMPONENTS; i++) {
    free(tmpbuf[i]);
    free(inbuf[i]);
  }
  free(_tmpbuf);
  if (this->jerr.warning) retval = -1;
  this->jerr.stopOnWarning = FALSE;
  return retval;
}